

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# USS.h
# Opt level: O0

void __thiscall USS<4U>::Init(USS<4U> *this,Data<4U> *item)

{
  bool bVar1;
  result_type rVar2;
  count_type cVar3;
  Data<4U> *in_stack_00000010;
  bool in_stack_00000047;
  Data<4U> *in_stack_00000048;
  StreamSummary<4U> *in_stack_00000050;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  bVar1 = StreamSummary<4U>::Add_Data((StreamSummary<4U> *)item,in_stack_00000010);
  if (!bVar1) {
    bVar1 = StreamSummary<4U>::isFull
                      ((StreamSummary<4U> *)
                       CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    if (bVar1) {
      rVar2 = std::random_device::operator()((random_device *)0x116cae);
      cVar3 = StreamSummary<4U>::Min_Num
                        ((StreamSummary<4U> *)CONCAT44(rVar2,in_stack_ffffffffffffffe0));
      if (rVar2 % (cVar3 + 1U) == 0) {
        StreamSummary<4U>::Add_Counter(in_stack_00000050,in_stack_00000048,in_stack_00000047);
      }
      else {
        StreamSummary<4U>::Add_Min((StreamSummary<4U> *)CONCAT44(rVar2,in_stack_ffffffffffffffe0));
      }
    }
    else {
      StreamSummary<4U>::Add_Counter(in_stack_00000050,in_stack_00000048,in_stack_00000047);
    }
  }
  return;
}

Assistant:

void Init(const Data<DATA_LEN>& item) {
		if (!summary->Add_Data(item)) {
			if (summary->isFull()) {
				if (rd() % (summary->Min_Num() + 1) == 0) {
					summary->Add_Counter(item, false);
				}
				else {
					summary->Add_Min();
				}
			}
			else {
				summary->Add_Counter(item, true);
			}
		}
	}